

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcOccluded4(int *valid,RTCScene hscene,RTCRay4 *ray,RTCOccludedArguments *args)

{
  long lVar1;
  RayHit ray1;
  RayQueryContext context;
  RTCRayQueryContext defaultContext;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  RTCScene local_70;
  RTCRayQueryContext *local_68;
  RTCOccludedArguments *local_60;
  RTCRayQueryContext local_58;
  RTCOccludedArguments local_50;
  
  if (args == (RTCOccludedArguments *)0x0) {
    args = &local_50;
    local_50.flags = RTC_RAY_QUERY_FLAG_INCOHERENT;
    local_50.feature_mask = RTC_FEATURE_FLAG_ALL;
    local_50.context = (RTCRayQueryContext *)0x0;
    local_50.filter = (RTCFilterFunctionN)0x0;
    local_50.occluded = (RTCOccludedFunctionN)0x0;
  }
  else {
    local_68 = args->context;
    if (local_68 != (RTCRayQueryContext *)0x0) goto LAB_0091c4f6;
  }
  local_68 = &local_58;
  local_58.instID[0] = 0xffffffff;
  local_58.instPrimID[0] = 0xffffffff;
LAB_0091c4f6:
  local_70 = hscene;
  local_60 = args;
  if (*(long *)(hscene + 0xa8) == 0) {
    lVar1 = -0x10;
    do {
      if (*(int *)((long)valid + lVar1 + 0x10) != 0) {
        local_d8 = *(undefined4 *)((long)ray->org_y + lVar1);
        local_d4 = *(undefined4 *)((long)ray->org_z + lVar1);
        local_d0 = *(undefined4 *)((long)ray->tnear + lVar1);
        local_cc = *(undefined4 *)((long)ray->dir_x + lVar1);
        local_c8 = *(undefined4 *)((long)ray->dir_y + lVar1);
        local_c4 = *(undefined4 *)((long)ray->dir_z + lVar1);
        local_c0 = *(undefined4 *)((long)ray->time + lVar1);
        local_b8 = *(undefined4 *)((long)ray->mask + lVar1);
        local_bc = *(undefined4 *)((long)ray->tfar + lVar1);
        local_b4 = *(undefined4 *)((long)ray->id + lVar1);
        local_b0 = *(undefined4 *)((long)ray->flags + lVar1);
        local_ac = *(undefined4 *)((long)ray[1].org_x + lVar1);
        local_a8 = *(undefined4 *)((long)ray[1].org_y + lVar1);
        local_a4 = *(undefined4 *)((long)ray[1].org_z + lVar1);
        local_a0 = *(undefined4 *)((long)ray[1].tnear + lVar1);
        local_9c = *(undefined4 *)((long)ray[1].dir_x + lVar1);
        local_98 = *(undefined4 *)((long)ray[1].dir_y + lVar1);
        local_94 = *(undefined4 *)((long)ray[1].dir_z + lVar1);
        local_90 = *(undefined4 *)((long)ray[1].time + lVar1);
        local_8c = *(undefined4 *)((long)ray[1].tfar + lVar1);
        local_88 = *(undefined4 *)((long)ray[1].mask + lVar1);
        (**(code **)(hscene + 0x80))(hscene + 0x58,&local_d8,&local_70);
        *(undefined4 *)((long)ray[1].time + lVar1) = local_90;
      }
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0);
  }
  else {
    (**(code **)(hscene + 0xa0))(valid,hscene + 0x58,ray,&local_70);
  }
  return;
}

Assistant:

RTC_API void rtcOccluded4 (const int* valid, RTCScene hscene, RTCRay4* ray, RTCOccludedArguments* args) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcOccluded4);

#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    if (((size_t)valid) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 16 bytes");   
    if (((size_t)ray)   & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "ray not aligned to 16 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<4; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(shadow.travs,cnt,cnt,cnt);

    RTCOccludedArguments defaultArgs;
    if (unlikely(args == nullptr)) {
      rtcInitOccludedArguments(&defaultArgs);
      args = &defaultArgs;
    }
    RTCRayQueryContext* user_context = args->context;
    
    RTCRayQueryContext defaultContext;
    if (unlikely(user_context == nullptr)) {
      rtcInitRayQueryContext(&defaultContext);
      user_context = &defaultContext;
    }
    RayQueryContext context(scene,user_context,args);

    if (likely(scene->intersectors.intersector4))
       scene->intersectors.occluded4(valid,*ray,&context);

    else {
      RayHit4* ray4 = (RayHit4*) ray;
      for (size_t i=0; i<4; i++) {
        if (!valid[i]) continue;
        RayHit ray1; ray4->get(i,ray1);
        scene->intersectors.occluded((RTCRay&)ray1,&context);
        ray4->geomID[i] = ray1.geomID; 
      }
    }
    
    RTC_CATCH_END2(scene);
  }